

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FState * __thiscall PClassActor::FindState(PClassActor *this,int numnames,FName *names,bool exact)

{
  FName local_58;
  FName local_54;
  FStateLabel *pFStack_50;
  FName label;
  FStateLabel *slabel;
  FState *pFStack_40;
  int count;
  FState *best;
  FStateLabels *labels;
  FName *pFStack_28;
  bool exact_local;
  FName *names_local;
  int numnames_local;
  PClassActor *this_local;
  
  best = (FState *)this->StateList;
  pFStack_40 = (FState *)0x0;
  if (best != (FState *)0x0) {
    slabel._4_4_ = 0;
    pFStack_50 = (FStateLabel *)0x0;
    FName::FName(&local_54);
    pFStack_28 = names;
    while (best != (FState *)0x0 && slabel._4_4_ < numnames) {
      FName::operator=(&local_54,pFStack_28);
      FName::FName(&local_58,&local_54);
      pFStack_50 = FStateLabels::FindLabel((FStateLabels *)best,&local_58);
      if (pFStack_50 == (FStateLabel *)0x0) break;
      slabel._4_4_ = slabel._4_4_ + 1;
      pFStack_40 = pFStack_50->State;
      pFStack_28 = pFStack_28 + 1;
      best = (FState *)pFStack_50->Children;
    }
    if ((slabel._4_4_ < numnames) && (exact)) {
      return (FState *)0x0;
    }
  }
  return pFStack_40;
}

Assistant:

FState *PClassActor::FindState(int numnames, FName *names, bool exact) const
{
	FStateLabels *labels = StateList;
	FState *best = NULL;

	if (labels != NULL)
	{
		int count = 0;
		FStateLabel *slabel = NULL;
		FName label;

		// Find the best-matching label for this class.
		while (labels != NULL && count < numnames)
		{
			label = *names++;
			slabel = labels->FindLabel(label);

			if (slabel != NULL)
			{
				count++;
				labels = slabel->Children;
				best = slabel->State;
			}
			else
			{
				break;
			}
		}
		if (count < numnames && exact)
		{
			return NULL;
		}
	}
	return best;
}